

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystem.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_199c2b::MkdirCommand::getVerboseDescription
          (MkdirCommand *this,SmallVectorImpl<char> *result)

{
  string *psVar1;
  BuildNode *pBVar2;
  _Alloc_hider __s;
  size_t __n;
  char *__n_00;
  StringRef Str;
  StringRef Str_00;
  void *pvVar3;
  raw_ostream *prVar4;
  undefined8 in_RCX;
  void *__buf;
  void *__buf_00;
  StringRef Str_01;
  raw_svector_ostream os;
  raw_ostream local_50;
  SmallVectorImpl<char> *local_28;
  
  prVar4 = &local_50;
  local_50.BufferMode = InternalBuffer;
  local_50.OutBufStart = (char *)0x0;
  local_50.OutBufEnd = (char *)0x0;
  local_50.OutBufCur = (char *)0x0;
  local_50._vptr_raw_ostream = (_func_int **)&PTR__raw_ostream_0020d3c0;
  local_28 = result;
  llvm::raw_ostream::SetUnbuffered(prVar4);
  Str_01.Length = 9;
  Str_01.Data = "mkdir -p ";
  llvm::raw_ostream::operator<<(prVar4,Str_01);
  pBVar2 = *(this->super_ExternalCommand).super_Command.outputs.
            super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  psVar1 = &(pBVar2->super_Node).name;
  __s._M_p = (psVar1->_M_dataplus)._M_p;
  __n = (pBVar2->super_Node).name._M_string_length;
  Str.Data = (psVar1->_M_dataplus)._M_p;
  Str.Length = psVar1->_M_string_length;
  if (__n != 0) {
    pvVar3 = memchr(__s._M_p,0x20,__n);
    if ((long)pvVar3 - (long)__s._M_p != -1 && pvVar3 != (void *)0x0) {
      if (local_50.OutBufCur < local_50.OutBufEnd) {
        *local_50.OutBufCur = '\"';
        local_50.OutBufCur = local_50.OutBufCur + 1;
      }
      else {
        prVar4 = (raw_ostream *)
                 llvm::raw_ostream::write
                           (&local_50,0x22,__buf,
                            CONCAT71((int7)((ulong)in_RCX >> 8),pvVar3 == (void *)0x0));
      }
      pBVar2 = *(this->super_ExternalCommand).super_Command.outputs.
                super__Vector_base<llbuild::buildsystem::BuildNode_*,_std::allocator<llbuild::buildsystem::BuildNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      Str_00.Data = (pBVar2->super_Node).name._M_dataplus._M_p;
      Str_00.Length = (pBVar2->super_Node).name._M_string_length;
      prVar4 = llvm::raw_ostream::operator<<(prVar4,Str_00);
      __n_00 = prVar4->OutBufCur;
      if (__n_00 < prVar4->OutBufEnd) {
        prVar4->OutBufCur = __n_00 + 1;
        *__n_00 = '\"';
      }
      else {
        llvm::raw_ostream::write(prVar4,0x22,__buf_00,(size_t)__n_00);
      }
      goto LAB_0013eca5;
    }
  }
  llvm::raw_ostream::operator<<(&local_50,Str);
LAB_0013eca5:
  llvm::raw_ostream::~raw_ostream(&local_50);
  return;
}

Assistant:

virtual void getVerboseDescription(SmallVectorImpl<char> &result) const override {
    llvm::raw_svector_ostream os(result);
    os << "mkdir -p ";
    // FIXME: This isn't correct, we need utilities for doing shell quoting.
    if (StringRef(getOutputs()[0]->getName()).find(' ') != StringRef::npos) {
      os << '"' << getOutputs()[0]->getName() << '"';
    } else {
      os << getOutputs()[0]->getName();
    }
  }